

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.cpp
# Opt level: O2

void Ptex::v2_2::(anonymous_namespace)::Apply<Ptex::v2_2::PtexHalf,3>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int param_5)

{
  float fVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  float *pfVar5;
  PtexHalf *val;
  VecAccum<Ptex::v2_2::PtexHalf,_3> local_6a;
  VecMult<Ptex::v2_2::PtexHalf,_3> local_69;
  float local_68 [2];
  float local_60;
  long local_58;
  PtexSeparableKernel *local_50;
  float *local_48;
  PtexHalf *local_40;
  float *local_38;
  
  bVar2 = (k->res).ulog2;
  iVar3 = k->uw;
  local_38 = k->kv;
  val = (PtexHalf *)(((long)(k->v << (bVar2 & 0x1f)) + (long)k->u) * 6 + (long)data);
  local_58 = (long)(3 << (bVar2 & 0x1f));
  local_40 = val + k->vw * local_58;
  local_58 = local_58 * 2;
  local_50 = k;
  local_48 = result;
  for (; val != local_40; val = (PtexHalf *)((long)&val->bits + local_58)) {
    pfVar5 = local_50->ku;
    PtexUtils::VecMult<Ptex::v2_2::PtexHalf,_3>::operator()(&local_69,local_68,val,*pfVar5);
    for (lVar4 = 6; pfVar5 = pfVar5 + 1, (long)(iVar3 * 3) * 2 != lVar4; lVar4 = lVar4 + 6) {
      PtexUtils::VecAccum<Ptex::v2_2::PtexHalf,_3>::operator()
                (&local_6a,local_68,(PtexHalf *)((long)&val->bits + lVar4),*pfVar5);
    }
    fVar1 = *local_38;
    local_38 = local_38 + 1;
    *(ulong *)local_48 =
         CONCAT44(fVar1 * local_68[1] + (float)((ulong)*(undefined8 *)local_48 >> 0x20),
                  fVar1 * local_68[0] + (float)*(undefined8 *)local_48);
    local_48[2] = fVar1 * local_60 + local_48[2];
  }
  return;
}

Assistant:

void Apply(PtexSeparableKernel& k, float* result, void* data, int /*nChan*/, int /*nTxChan*/)
    {
        float* rowResult = (float*) alloca(nChan*sizeof(float));
        int rowlen = k.res.u() * nChan;
        int datalen = k.uw * nChan;
        int rowskip = rowlen - datalen;
        float* kvp = k.kv;
        T* p = static_cast<T*>(data) + (k.v * k.res.u() + k.u) * nChan;
        T* pEnd = p + k.vw * rowlen;
        while (p != pEnd)
        {
            float* kup = k.ku;
            T* pRowEnd = p + datalen;
            // just mult and copy first element
            PtexUtils::VecMult<T,nChan>()(rowResult, p, *kup++);
            p += nChan;
            // accumulate remaining elements
            while (p != pRowEnd) {
                // rowResult[i] = p[i] * ku[u] for i in {0..n-1}
                PtexUtils::VecAccum<T,nChan>()(rowResult, p, *kup++);
                p += nChan;
            }
            // result[i] += rowResult[i] * kv[v] for i in {0..n-1}
            PtexUtils::VecAccum<float,nChan>()(result, rowResult, *kvp++);
            p += rowskip;
        }
    }